

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> *
unodb::detail::copy_atomic_to_nonatomic<std::array<std::atomic<unsigned_long>,4ul>const>
          (array<std::atomic<unsigned_long>,_4UL> *atomic_array)

{
  size_type i;
  long lVar1;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> *in_RDI;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    in_RDI->_M_elems[lVar1] = atomic_array->_M_elems[lVar1].super___atomic_base<unsigned_long>._M_i;
  }
  return in_RDI;
}

Assistant:

inline non_atomic_array<T> copy_atomic_to_nonatomic(T& atomic_array) noexcept {
  UNODB_DETAIL_DISABLE_MSVC_WARNING(26494)
  non_atomic_array<T> result;
  UNODB_DETAIL_RESTORE_MSVC_WARNINGS()

  for (typename decltype(result)::size_type i = 0; i < result.size(); ++i) {
    result[i] = atomic_array[i].load(std::memory_order_relaxed);
  }
  return result;
}